

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_263068::ECTest_ZeroPadding_Test::TestBody(ECTest_ZeroPadding_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pointer peVar4;
  uchar *puVar5;
  size_type sVar6;
  char *in_R9;
  string local_6d0;
  AssertHelper local_6b0;
  Message local_6a8;
  bool local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__10;
  uint8_t padded [33];
  string local_658;
  AssertHelper local_638;
  Message local_630;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_5f0;
  Message local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar__8;
  Message local_5c8;
  Bytes local_5c0;
  Span<const_unsigned_char> local_5b0;
  Bytes local_5a0;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_518;
  Message local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_488;
  Message local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__4;
  Message local_460;
  Bytes local_458;
  Span<const_unsigned_char> local_448;
  Bytes local_438;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_388;
  Message local_380;
  Span<const_unsigned_char> local_378;
  Bytes local_368;
  Bytes local_358;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_8;
  UniquePtr<uint8_t> free_buf_alloc;
  Message local_328;
  uint local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_7;
  size_t len;
  uint8_t *buf_alloc;
  Message local_2f0;
  Span<const_unsigned_char> local_2e8;
  Bytes local_2d8;
  Span<const_unsigned_char> local_2c8;
  Bytes local_2b8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_6;
  Message local_290;
  size_t local_288;
  uint local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_5;
  uint8_t large_buf [33];
  AssertHelper local_238;
  Message local_230;
  size_t local_228;
  uint local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_4;
  Message local_200;
  Span<const_unsigned_char> local_1f8;
  Bytes local_1e8;
  Span<const_unsigned_char> local_1d8;
  Bytes local_1c8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_3;
  Message local_1a0;
  size_t local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  uint8_t buf [32];
  AssertHelper local_150;
  Message local_148;
  size_t local_140;
  uint local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Message local_118;
  Bytes local_110;
  Span<const_unsigned_char> local_100;
  Bytes local_f0;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EC_KEY> key;
  ECTest_ZeroPadding_Test *this_local;
  
  DecodeECPrivateKey((anon_unknown_dwarf_263068 *)&gtest_ar_.message_,
                     (anonymous_namespace)::kECKeyWithZeros,0x79);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0xd0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__1.message_);
    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_99 = EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &gtest_ar__1.message_,peVar4);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_98,&local_99,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_98,
                 (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xd2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    bssl::Span<unsigned_char_const>::Span<121ul>
              ((Span<unsigned_char_const> *)&local_100,
               (uchar (*) [121])(anonymous_namespace)::kECKeyWithZeros);
    Bytes::Bytes(&local_f0,local_100);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &gtest_ar__1.message_);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &gtest_ar__1.message_);
    Bytes::Bytes(&local_110,puVar5,sVar6);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_e0,"Bytes(kECKeyWithZeros)","Bytes(out.data(), out.size())",
               &local_f0,&local_110);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xd3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    local_134 = 0x20;
    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_140 = EC_KEY_priv2oct(peVar4,(uint8_t *)0x0,0);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_130,"32u","EC_KEY_priv2oct(key.get(), nullptr, 0)",&local_134,
               &local_140);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xd6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    local_18c = 0x20;
    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_198 = EC_KEY_priv2oct(peVar4,(uint8_t *)&gtest_ar_2.message_,0x20);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_188,"32u","EC_KEY_priv2oct(key.get(), buf, sizeof(buf))",&local_18c
               ,&local_198);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0xd8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (bVar1) {
      bssl::Span<unsigned_char_const>::Span<32ul>
                ((Span<unsigned_char_const> *)&local_1d8,(uchar (*) [32])&gtest_ar_2.message_);
      Bytes::Bytes(&local_1c8,local_1d8);
      bssl::Span<unsigned_char_const>::Span<32ul>
                ((Span<unsigned_char_const> *)&local_1f8,
                 (uchar (*) [32])(anonymous_namespace)::kECKeyWithZerosRawPrivate);
      Bytes::Bytes(&local_1e8,local_1f8);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_1b8,"Bytes(buf)","Bytes(kECKeyWithZerosRawPrivate)",&local_1c8,
                 &local_1e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xd9,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_200);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      local_21c = 0;
      peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_228 = EC_KEY_priv2oct(peVar4,(uint8_t *)&gtest_ar_2.message_,0x1f);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_218,"0u","EC_KEY_priv2oct(key.get(), buf, sizeof(buf) - 1)",
                 &local_21c,&local_228);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xdc,pcVar3);
        testing::internal::AssertHelper::operator=(&local_238,&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        testing::Message::~Message(&local_230);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      local_27c = 0x20;
      peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_288 = EC_KEY_priv2oct(peVar4,(uint8_t *)&gtest_ar_5.message_,0x21);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_278,"32u",
                 "EC_KEY_priv2oct(key.get(), large_buf, sizeof(large_buf))",&local_27c,&local_288);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
      if (!bVar1) {
        testing::Message::Message(&local_290);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0xe0,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_290);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_290);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
      if (bVar1) {
        bssl::Span<unsigned_char_const>::Span<32ul>
                  ((Span<unsigned_char_const> *)&local_2c8,(uchar (*) [32])&gtest_ar_2.message_);
        Bytes::Bytes(&local_2b8,local_2c8);
        bssl::Span<unsigned_char_const>::Span<32ul>
                  ((Span<unsigned_char_const> *)&local_2e8,
                   (uchar (*) [32])(anonymous_namespace)::kECKeyWithZerosRawPrivate);
        Bytes::Bytes(&local_2d8,local_2e8);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_2a8,"Bytes(buf)","Bytes(kECKeyWithZerosRawPrivate)",&local_2b8,
                   &local_2d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
        if (!bVar1) {
          testing::Message::Message(&local_2f0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&buf_alloc,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0xe1,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&buf_alloc,&local_2f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf_alloc);
          testing::Message::~Message(&local_2f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
        peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        gtest_ar_7.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )EC_KEY_priv2buf(peVar4,(uint8_t **)&len);
        local_31c = 0;
        testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                  ((internal *)local_318,"len","0u",(unsigned_long *)&gtest_ar_7.message_,&local_31c
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
        if (!bVar1) {
          testing::Message::Message(&local_328);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&free_buf_alloc,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0xe6,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&free_buf_alloc,&local_328);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&free_buf_alloc);
          testing::Message::~Message(&local_328);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
        if (bVar1) {
          std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar_8.message_,
                     (pointer)len);
          Bytes::Bytes(&local_358,(uint8_t *)len,
                       (size_t)gtest_ar_7.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
          bssl::Span<unsigned_char_const>::Span<32ul>
                    ((Span<unsigned_char_const> *)&local_378,
                     (uchar (*) [32])(anonymous_namespace)::kECKeyWithZerosRawPrivate);
          Bytes::Bytes(&local_368,local_378);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_348,"Bytes(buf_alloc, len)",
                     "Bytes(kECKeyWithZerosRawPrivate)",&local_358,&local_368);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
          if (!bVar1) {
            testing::Message::Message(&local_380);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
            testing::internal::AssertHelper::AssertHelper
                      (&local_388,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xe8,pcVar3);
            testing::internal::AssertHelper::operator=(&local_388,&local_380);
            testing::internal::AssertHelper::~AssertHelper(&local_388);
            testing::Message::~Message(&local_380);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
          DecodeECPrivateKey((anon_unknown_dwarf_263068 *)&gtest_ar__2.message_,
                             (anonymous_namespace)::kECKeyMissingZeros,0x5a);
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::operator=
                    ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                     (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_3a0,
                     (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
          if (!bVar1) {
            testing::Message::Message(&local_3a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__3.message_,(internal *)local_3a0,
                       (AssertionResult *)0x8f28b1,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0xec,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
            testing::internal::AssertHelper::~AssertHelper(&local_3b0);
            std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_3a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
          if (bVar1) {
            peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_3e1 = EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &gtest_ar__1.message_,peVar4);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
            if (!bVar1) {
              testing::Message::Message(&local_3f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_9.message_,(internal *)local_3e0,
                         (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false","true",
                         in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0xed,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
              testing::internal::AssertHelper::~AssertHelper(&local_3f8);
              std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_3f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
            bssl::Span<unsigned_char_const>::Span<121ul>
                      ((Span<unsigned_char_const> *)&local_448,
                       (uchar (*) [121])(anonymous_namespace)::kECKeyWithZeros);
            Bytes::Bytes(&local_438,local_448);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar__1.message_);
            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &gtest_ar__1.message_);
            Bytes::Bytes(&local_458,puVar5,sVar6);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_428,"Bytes(kECKeyWithZeros)",
                       "Bytes(out.data(), out.size())",&local_438,&local_458);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
            if (!bVar1) {
              testing::Message::Message(&local_460);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0xee,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4.message_,&local_460);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_460);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
            peVar4 = (pointer)EC_KEY_new_by_curve_name(0x19f);
            std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::reset
                      ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,peVar4)
            ;
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_478,
                       (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
            if (!bVar1) {
              testing::Message::Message(&local_480);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_478,
                         (AssertionResult *)0x8f28b1,"false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_488,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0xf2,pcVar3);
              testing::internal::AssertHelper::operator=(&local_488,&local_480);
              testing::internal::AssertHelper::~AssertHelper(&local_488);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_480);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
            if (bVar1) {
              peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                  &gtest_ar_.message_);
              local_4bc = EC_KEY_oct2key(peVar4,(anonymous_namespace)::kECKeyWithZerosPublic,0x41,
                                         (BN_CTX *)0x0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_4b8,&local_4bc,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
              if (!bVar1) {
                testing::Message::Message(&local_4c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_4b8,
                           (AssertionResult *)
                           "EC_KEY_oct2key(key.get(), kECKeyWithZerosPublic, sizeof(kECKeyWithZerosPublic), nullptr)"
                           ,"false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0xf4,pcVar3);
                testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_4c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
              if (bVar1) {
                peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_504 = EC_KEY_oct2priv(peVar4,(anonymous_namespace)::kECKeyWithZerosRawPrivate,
                                            0x20);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_500,&local_504,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_500);
                if (!bVar1) {
                  testing::Message::Message(&local_510);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__7.message_,(internal *)local_500,
                             (AssertionResult *)
                             "EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate, sizeof(kECKeyWithZerosRawPrivate))"
                             ,"false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_518,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0xf6,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_518,&local_510);
                  testing::internal::AssertHelper::~AssertHelper(&local_518);
                  std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                  testing::Message::~Message(&local_510);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
                if (bVar1) {
                  peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_549 = EncodeECPrivateKey((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__1.message_,peVar4);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_548,&local_549,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_548);
                  if (!bVar1) {
                    testing::Message::Message(&local_558);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar_10.message_,(internal *)local_548,
                               (AssertionResult *)"EncodeECPrivateKey(&out, key.get())","false",
                               "true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_560,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                               ,0xf7,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_560,&local_558);
                    testing::internal::AssertHelper::~AssertHelper(&local_560);
                    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
                    testing::Message::~Message(&local_558);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
                  bssl::Span<unsigned_char_const>::Span<121ul>
                            ((Span<unsigned_char_const> *)&local_5b0,
                             (uchar (*) [121])(anonymous_namespace)::kECKeyWithZeros);
                  Bytes::Bytes(&local_5a0,local_5b0);
                  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &gtest_ar__1.message_);
                  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &gtest_ar__1.message_);
                  Bytes::Bytes(&local_5c0,puVar5,sVar6);
                  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                            ((EqHelper *)local_590,"Bytes(kECKeyWithZeros)",
                             "Bytes(out.data(), out.size())",&local_5a0,&local_5c0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_590);
                  if (!bVar1) {
                    testing::Message::Message(&local_5c8);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_590)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                               ,0xf8,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__8.message_,&local_5c8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_5c8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
                  peVar4 = (pointer)EC_KEY_new_by_curve_name(0x19f);
                  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::reset
                            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                             peVar4);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<ec_key_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_5e0,
                             (unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
                             (type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_5e0);
                  if (!bVar1) {
                    testing::Message::Message(&local_5e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__9.message_,(internal *)local_5e0,
                               (AssertionResult *)0x8f28b1,"false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_5f0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                               ,0xfc,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
                    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                    testing::Message::~Message(&local_5e8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
                  if (bVar1) {
                    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    iVar2 = EC_KEY_oct2priv(peVar4,(anonymous_namespace)::kECKeyWithZerosRawPrivate
                                                   + 1,0x1f);
                    local_621 = iVar2 == 0;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_620,&local_621,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_620);
                    if (!bVar1) {
                      testing::Message::Message(&local_630);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_658,(internal *)local_620,
                                 (AssertionResult *)
                                 "EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate + 1, sizeof(kECKeyWithZerosRawPrivate) - 1)"
                                 ,"true","false",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_638,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                                 ,0xfe,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_638,&local_630);
                      testing::internal::AssertHelper::~AssertHelper(&local_638);
                      std::__cxx11::string::~string((string *)&local_658);
                      testing::Message::~Message(&local_630);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_1_ = 0;
                    gtest_ar__10.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_7_ = 0;
                    peVar4 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    iVar2 = EC_KEY_oct2priv(peVar4,(uint8_t *)&gtest_ar__10.message_,0x21);
                    local_699 = iVar2 == 0;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_698,&local_699,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_698);
                    if (!bVar1) {
                      testing::Message::Message(&local_6a8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_6d0,(internal *)local_698,
                                 (AssertionResult *)
                                 "EC_KEY_oct2priv(key.get(), padded, sizeof(padded))","true","false"
                                 ,in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_6b0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                                 ,0x102,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
                      testing::internal::AssertHelper::~AssertHelper(&local_6b0);
                      std::__cxx11::string::~string((string *)&local_6d0);
                      testing::Message::~Message(&local_6a8);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
                  }
                }
              }
            }
          }
          std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar_8.message_);
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ECTest, ZeroPadding) {
  // Check that the correct encoding round-trips.
  bssl::UniquePtr<EC_KEY> key =
      DecodeECPrivateKey(kECKeyWithZeros, sizeof(kECKeyWithZeros));
  ASSERT_TRUE(key);
  std::vector<uint8_t> out;
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // Check the private key encodes correctly, including with the leading zeros.
  EXPECT_EQ(32u, EC_KEY_priv2oct(key.get(), nullptr, 0));
  uint8_t buf[32];
  ASSERT_EQ(32u, EC_KEY_priv2oct(key.get(), buf, sizeof(buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kECKeyWithZerosRawPrivate));

  // Buffer too small.
  EXPECT_EQ(0u, EC_KEY_priv2oct(key.get(), buf, sizeof(buf) - 1));

  // Extra space in buffer.
  uint8_t large_buf[33];
  ASSERT_EQ(32u, EC_KEY_priv2oct(key.get(), large_buf, sizeof(large_buf)));
  EXPECT_EQ(Bytes(buf), Bytes(kECKeyWithZerosRawPrivate));

  // Allocating API.
  uint8_t *buf_alloc;
  size_t len = EC_KEY_priv2buf(key.get(), &buf_alloc);
  ASSERT_GT(len, 0u);
  bssl::UniquePtr<uint8_t> free_buf_alloc(buf_alloc);
  EXPECT_EQ(Bytes(buf_alloc, len), Bytes(kECKeyWithZerosRawPrivate));

  // Keys without leading zeros also parse, but they encode correctly.
  key = DecodeECPrivateKey(kECKeyMissingZeros, sizeof(kECKeyMissingZeros));
  ASSERT_TRUE(key);
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // Test the key can be constructed with |EC_KEY_oct2*|.
  key.reset(EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_oct2key(key.get(), kECKeyWithZerosPublic,
                             sizeof(kECKeyWithZerosPublic), nullptr));
  ASSERT_TRUE(EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate,
                              sizeof(kECKeyWithZerosRawPrivate)));
  EXPECT_TRUE(EncodeECPrivateKey(&out, key.get()));
  EXPECT_EQ(Bytes(kECKeyWithZeros), Bytes(out.data(), out.size()));

  // |EC_KEY_oct2priv|'s format is fixed-width and must match the group order.
  key.reset(EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  ASSERT_TRUE(key);
  EXPECT_FALSE(EC_KEY_oct2priv(key.get(), kECKeyWithZerosRawPrivate + 1,
                               sizeof(kECKeyWithZerosRawPrivate) - 1));
  uint8_t padded[sizeof(kECKeyWithZerosRawPrivate) + 1] = {0};
  memcpy(padded + 1, kECKeyWithZerosRawPrivate,
         sizeof(kECKeyWithZerosRawPrivate));
  EXPECT_FALSE(EC_KEY_oct2priv(key.get(), padded, sizeof(padded)));
}